

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinfl.h
# Opt level: O1

void sinfl_build(uint *tbl,uchar *lens,int tbl_bits,int maxlen,int symcnt)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int *piVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  int cnt [16];
  int off [16];
  short sort [288];
  ushort *local_308;
  int local_2f8 [32];
  ushort auStack_278 [292];
  
  local_2f8[0xc] = 0;
  local_2f8[0xd] = 0;
  local_2f8[0xe] = 0;
  local_2f8[0xf] = 0;
  local_2f8[8] = 0;
  local_2f8[9] = 0;
  local_2f8[10] = 0;
  local_2f8[0xb] = 0;
  local_2f8[4] = 0;
  local_2f8[5] = 0;
  local_2f8[6] = 0;
  local_2f8[7] = 0;
  local_2f8[0] = 0;
  local_2f8[1] = 0;
  local_2f8[2] = 0;
  local_2f8[3] = 0;
  local_2f8[0x1c] = 0;
  local_2f8[0x1d] = 0;
  local_2f8[0x1e] = 0;
  local_2f8[0x1f] = 0;
  local_2f8[0x18] = 0;
  local_2f8[0x19] = 0;
  local_2f8[0x1a] = 0;
  local_2f8[0x1b] = 0;
  local_2f8[0x14] = 0;
  local_2f8[0x15] = 0;
  local_2f8[0x16] = 0;
  local_2f8[0x17] = 0;
  local_2f8[0x10] = 0;
  local_2f8[0x11] = 0;
  local_2f8[0x12] = 0;
  local_2f8[0x13] = 0;
  if (0 < symcnt) {
    uVar13 = 0;
    do {
      local_2f8[lens[uVar13]] = local_2f8[lens[uVar13]] + 1;
      uVar13 = uVar13 + 1;
    } while ((uint)symcnt != uVar13);
  }
  local_2f8[0x11] = local_2f8[0];
  if (maxlen < 2) {
    iVar18 = 0;
    uVar13 = 1;
  }
  else {
    iVar18 = 0;
    uVar13 = 1;
    iVar15 = local_2f8[0];
    do {
      piVar14 = local_2f8 + uVar13;
      iVar15 = iVar15 + *piVar14;
      local_2f8[uVar13 + 0x11] = iVar15;
      uVar13 = uVar13 + 1;
      iVar18 = *piVar14 + iVar18 * 2;
    } while ((uint)maxlen != uVar13);
    iVar18 = iVar18 * 2;
  }
  iVar15 = local_2f8[uVar13];
  if (0 < symcnt) {
    uVar13 = 0;
    do {
      iVar8 = local_2f8[(ulong)lens[uVar13] + 0x10];
      local_2f8[(ulong)lens[uVar13] + 0x10] = iVar8 + 1;
      auStack_278[iVar8] = (ushort)uVar13;
      uVar13 = uVar13 + 1;
    } while ((uint)symcnt != uVar13);
  }
  uVar13 = 1;
  bVar5 = (byte)tbl_bits;
  if (iVar18 + iVar15 < 1 << ((byte)maxlen & 0x1f)) {
    lVar4 = 0;
    do {
      tbl[lVar4] = 1;
      lVar4 = lVar4 + 1;
    } while ((uint)lVar4 >> (bVar5 & 0x1f) == 0);
  }
  else {
    iVar18 = local_2f8[1];
    if (local_2f8[1] == 0) {
      lVar4 = 2;
      do {
        iVar18 = local_2f8[lVar4];
        lVar4 = lVar4 + 1;
      } while (iVar18 == 0);
      uVar13 = (ulong)((int)lVar4 - 1);
    }
    local_308 = auStack_278 + local_2f8[0x10];
    if (tbl_bits < (int)uVar13) {
      bVar2 = true;
      uVar19 = 0;
    }
    else {
      iVar15 = 1 << ((byte)uVar13 & 0x1f);
      uVar7 = 0;
      do {
        do {
          tbl[(int)uVar7] = (uint)*local_308 << 0x10 | (uint)uVar13;
          uVar6 = iVar15 - 1;
          bVar2 = uVar7 != uVar6;
          if (uVar7 == uVar6) {
            uVar19 = uVar7;
            if ((int)(uint)uVar13 < tbl_bits) {
              do {
                memcpy(tbl + iVar15,tbl,(long)iVar15 * 4);
                iVar15 = iVar15 * 2;
                uVar10 = (int)uVar13 + 1;
                uVar13 = (ulong)uVar10;
              } while (tbl_bits != uVar10);
              uVar13 = (ulong)(uint)tbl_bits;
            }
          }
          else {
            uVar19 = 0x1f;
            if ((uVar6 ^ uVar7) != 0) {
              for (; (uVar6 ^ uVar7) >> uVar19 == 0; uVar19 = uVar19 - 1) {
              }
            }
            uVar19 = (1 << ((byte)uVar19 & 0x1f)) - 1U & uVar7 | 1 << (uVar19 & 0x1f);
          }
          local_308 = local_308 + 1;
          if (uVar7 == uVar6) goto LAB_001275ab;
          iVar18 = iVar18 + -1;
          uVar7 = uVar19;
        } while (iVar18 != 0);
        uVar13 = (long)(int)uVar13;
        do {
          uVar20 = uVar13;
          if ((long)uVar20 < (long)tbl_bits) {
            memcpy(tbl + iVar15,tbl,(long)iVar15 * 4);
            iVar15 = iVar15 * 2;
          }
          iVar18 = local_2f8[uVar20 + 1];
          uVar13 = uVar20 + 1;
        } while (iVar18 == 0);
      } while ((int)uVar20 < tbl_bits);
    }
LAB_001275ab:
    if (bVar2) {
      iVar15 = 1 << (bVar5 & 0x1f);
      uVar7 = iVar15 - 1;
      iVar8 = 0;
      uVar6 = 0xffffffff;
      do {
        uVar17 = (int)uVar13 - tbl_bits;
        iVar16 = 1 << ((byte)uVar17 & 0x1f);
        uVar10 = ~(-1 << ((byte)uVar13 & 0x1f));
        piVar14 = local_2f8 + (long)(int)uVar13 + 1;
        iVar12 = iVar15;
        do {
          uVar11 = uVar19 & uVar7;
          iVar15 = iVar12;
          if (uVar11 != uVar6) {
            piVar9 = piVar14;
            uVar6 = uVar17;
            iVar8 = iVar16;
            iVar15 = iVar18;
            if (iVar18 < iVar16) {
              do {
                uVar6 = uVar6 + 1;
                iVar8 = 1 << ((byte)uVar6 & 0x1f);
                iVar15 = iVar15 * 2 + *piVar9;
                piVar9 = piVar9 + 1;
              } while (iVar15 < iVar8);
            }
            tbl[uVar11] = (uVar6 & 0xf) + iVar12 * 0x10000 + 0x10;
            iVar15 = iVar8 + iVar12;
            iVar8 = iVar12;
            uVar6 = uVar11;
          }
          uVar1 = *local_308;
          lVar4 = (long)(((int)uVar19 >> (bVar5 & 0x1f)) + iVar8);
          do {
            tbl[lVar4] = (uint)uVar1 << 0x10 | uVar17 & 0xf;
            lVar4 = lVar4 + iVar16;
          } while (lVar4 < iVar15);
          if (uVar19 == uVar10) {
            return;
          }
          uVar3 = uVar19 ^ uVar10;
          uVar11 = 0x1f;
          if (uVar3 != 0) {
            for (; uVar3 >> uVar11 == 0; uVar11 = uVar11 - 1) {
            }
          }
          local_308 = local_308 + 1;
          uVar19 = uVar19 & (1 << ((byte)uVar11 & 0x1f)) - 1U | 1 << (uVar11 & 0x1f);
          iVar18 = iVar18 + -1;
          iVar12 = iVar15;
        } while (iVar18 != 0);
        do {
          iVar18 = *piVar14;
          uVar13 = (ulong)((int)uVar13 + 1);
          piVar14 = piVar14 + 1;
        } while (iVar18 == 0);
      } while( true );
    }
  }
  return;
}

Assistant:

static void
sinfl_build(unsigned *tbl, unsigned char *lens, int tbl_bits, int maxlen,
            int symcnt) {
  int i, used = 0;
  short sort[288];
  int cnt[16] = {0}, off[16]= {0};
  struct sinfl_gen gen = {0};
  gen.sorted = sort;
  gen.len = 1;

  for (i = 0; i < symcnt; ++i)
    cnt[lens[i]]++;
  off[1] = cnt[0];
  for (i = 1; i < maxlen; ++i) {
    off[i + 1] = off[i] + cnt[i];
    used = (used << 1) + cnt[i];
  }
  used = (used << 1) + cnt[i];
  for (i = 0; i < symcnt; ++i)
    gen.sorted[off[lens[i]]++] = (short)i;
  gen.sorted += off[0];

  if (used < (1 << maxlen)){
    for (i = 0; i < 1 << tbl_bits; ++i)
      tbl[i] = (0 << 16u) | 1;
    return;
  }
  if (!sinfl_build_tbl(&gen, tbl, tbl_bits, cnt)){
    sinfl_build_subtbl(&gen, tbl, tbl_bits, cnt);
  }
}